

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

SQInteger __thiscall
SQVM::FallBackGet(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *dest)

{
  int iVar1;
  long *plVar2;
  byte bVar3;
  bool bVar4;
  SQVM *in_RCX;
  SQCollectable *in_RDX;
  SQCollectable *in_RSI;
  SQSharedState *in_RDI;
  AutoDec ad;
  SQObjectPtr closure;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  SQObjectPtr *in_stack_ffffffffffffff70;
  SQVM *this_00;
  undefined7 in_stack_ffffffffffffff78;
  SQVM *in_stack_ffffffffffffff80;
  AutoDec local_60;
  SQUnsignedInteger in_stack_ffffffffffffffb0;
  SQWeakRef *in_stack_ffffffffffffffb8;
  SQCollectable *in_stack_ffffffffffffffc0;
  SQCollectable *in_stack_ffffffffffffffc8;
  SQSharedState *in_stack_ffffffffffffffd0;
  SQSharedState *pSVar5;
  SQVM *in_stack_fffffffffffffff8;
  
  iVar1 = *(int *)&(in_RSI->super_SQRefCounted)._vptr_SQRefCounted;
  pSVar5 = in_RDI;
  if ((iVar1 == 0xa000020) || (iVar1 == 0xa000080)) {
    if (*(long *)((in_RSI->super_SQRefCounted)._uiRef + 0x30) == 0) {
      return 1;
    }
    in_stack_ffffffffffffff80 = (SQVM *)&stack0xffffffffffffffc8;
    ::SQObjectPtr::SQObjectPtr
              ((SQObjectPtr *)in_stack_ffffffffffffff80,
               *(SQTable **)((in_RSI->super_SQRefCounted)._uiRef + 0x30));
    bVar4 = Get(in_RCX,(SQObjectPtr *)in_stack_ffffffffffffffd0,
                (SQObjectPtr *)in_stack_ffffffffffffffc8,(SQObjectPtr *)in_stack_ffffffffffffffc0,
                (SQUnsignedInteger)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    ::SQObjectPtr::~SQObjectPtr(in_stack_ffffffffffffff70);
    if (bVar4) {
      return 0;
    }
  }
  else if (iVar1 != 0xa008000) {
    return 1;
  }
  this_00 = (SQVM *)&stack0xffffffffffffffa8;
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)this_00);
  plVar2 = (long *)(in_RSI->super_SQRefCounted)._uiRef;
  bVar3 = (**(code **)(*plVar2 + 0x30))(plVar2,in_RDI,7,this_00);
  if ((bVar3 & 1) != 0) {
    Push(this_00,(SQObjectPtr *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    Push(this_00,(SQObjectPtr *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    (in_RDI->_instance_default_delegate).super_SQObject._unVal.pTable =
         (SQTable *)
         ((long)&(((in_RDI->_instance_default_delegate).super_SQObject._unVal.pTable)->
                 super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted + 1);
    AutoDec::AutoDec(&local_60,&(in_RDI->_instance_default_delegate).super_SQObject._unVal.nInteger)
    ;
    bVar4 = Call(in_stack_fffffffffffffff8,(SQObjectPtr *)pSVar5,(SQInteger)in_RSI,(SQInteger)in_RDX
                 ,(SQObjectPtr *)in_RCX,(SQBool)in_stack_ffffffffffffffd0);
    if (bVar4) {
      Pop(in_stack_ffffffffffffff80,CONCAT17(bVar3,in_stack_ffffffffffffff78));
      in_stack_fffffffffffffff8 = (SQVM *)0x0;
      bVar4 = true;
    }
    else {
      Pop(in_stack_ffffffffffffff80,CONCAT17(bVar3,in_stack_ffffffffffffff78));
      if ((in_RDI->_consts).super_SQObject._unVal.fFloat == 2.350989e-38) {
        bVar4 = false;
      }
      else {
        in_stack_fffffffffffffff8 = (SQVM *)0x2;
        bVar4 = true;
      }
    }
    AutoDec::~AutoDec(&local_60);
    if (bVar4) goto LAB_0013988b;
  }
  bVar4 = false;
LAB_0013988b:
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this_00);
  if (!bVar4) {
    return 1;
  }
  return (SQInteger)in_stack_fffffffffffffff8;
}

Assistant:

SQInteger SQVM::FallBackGet(const SQObjectPtr &self,const SQObjectPtr &key,SQObjectPtr &dest)
{
    switch(sq_type(self)){
    case OT_TABLE:
    case OT_USERDATA:
        //delegation
        if(_delegable(self)->_delegate) {
            if(Get(SQObjectPtr(_delegable(self)->_delegate),key,dest,0,DONT_FALL_BACK)) return FALLBACK_OK;
        }
        else {
            return FALLBACK_NO_MATCH;
        }
        //go through
    case OT_INSTANCE: {
        SQObjectPtr closure;
        if(_delegable(self)->GetMetaMethod(this, MT_GET, closure)) {
            Push(self);Push(key);
            _nmetamethodscall++;
            AutoDec ad(&_nmetamethodscall);
            if(Call(closure, 2, _top - 2, dest, SQFalse)) {
                Pop(2);
                return FALLBACK_OK;
            }
            else {
                Pop(2);
                if(sq_type(_lasterror) != OT_NULL) { //NULL means "clean failure" (not found)
                    return FALLBACK_ERROR;
                }
            }
        }
                      }
        break;
    default: break;//shutup GCC 4.x
    }
    // no metamethod or no fallback type
    return FALLBACK_NO_MATCH;
}